

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O3

void __thiscall streams_tests::bitstream_reader_writer::test_method(bitstream_reader_writer *this)

{
  size_t in_RCX;
  size_t __nbytes;
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  check_type cVar3;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined4 local_1b4;
  undefined4 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  BitStreamReader<DataStream> bit_reader;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  uint16_t serialized_int2;
  lazy_ostream local_150;
  undefined1 *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  uint32_t serialized_int1;
  DataStream data_copy;
  BitStreamWriter<DataStream> bit_writer;
  DataStream local_d8;
  undefined4 *local_b0;
  assertion_result local_a8;
  undefined4 ***local_90;
  undefined4 **local_88;
  uint32_t obj;
  bool local_78;
  undefined1 *local_70;
  BitStreamReader<DataStream> *local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bit_writer.m_ostream = &local_d8;
  local_d8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.m_read_pos = 0;
  local_d8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bit_writer.m_buffer = '\0';
  bit_writer.m_offset = 0;
  BitStreamWriter<DataStream>::Write(&bit_writer,0,1);
  BitStreamWriter<DataStream>::Write(&bit_writer,2,2);
  BitStreamWriter<DataStream>::Write(&bit_writer,6,3);
  BitStreamWriter<DataStream>::Write(&bit_writer,0xb,4);
  BitStreamWriter<DataStream>::Write(&bit_writer,1,5);
  BitStreamWriter<DataStream>::Write(&bit_writer,0x20,6);
  BitStreamWriter<DataStream>::Write(&bit_writer,7,7);
  BitStreamWriter<DataStream>::Write(&bit_writer,0x7721,0x10);
  BitStreamWriter<DataStream>::Flush(&bit_writer);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::vector
            (&data_copy.vch,&local_d8.vch);
  data_copy.m_read_pos = local_d8.m_read_pos;
  DataStream::read(&local_d8,(int)&obj,(void *)0x4,in_RCX);
  serialized_int1 = obj;
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xcc;
  file.m_begin = (iterator)&local_120;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_130,msg);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_88 = &local_b0;
  bit_reader.m_istream = (DataStream *)&serialized_int1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(serialized_int1 == 0x7700c35a);
  local_b0 = (undefined4 *)CONCAT44(local_b0._4_4_,0x7700c35a);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_58 = "";
  local_78 = false;
  _obj = &PTR__lazy_ostream_01388f88;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_01388f88;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  __nbytes = 0xcc;
  local_68 = &bit_reader;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_150,1,2,REQUIRE,0xf1da20,(size_t)&local_60,0xcc,&obj,
             "uint32_t{0x7700C35A}",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  DataStream::read(&local_d8,(int)&obj,(void *)0x2,__nbytes);
  serialized_int2 = (uint16_t)obj;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xcf;
  file_00.m_begin = (iterator)&local_168;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
             msg_00);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_b0 = (undefined4 *)CONCAT62(local_b0._2_6_,0x1072);
  bit_reader.m_istream = (DataStream *)&serialized_int2;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(serialized_int2 == 0x1072);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_58 = "";
  local_78 = false;
  _obj = &PTR__lazy_ostream_01389bb8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_b0;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_01389bb8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_88;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_68 = &bit_reader;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_150,1,2,REQUIRE,0xf1da45,(size_t)&local_60,0xcf,&obj,
             "uint16_t{0x1072}",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  bit_reader.m_istream = &data_copy;
  bit_reader.m_buffer = '\0';
  bit_reader.m_offset = 8;
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xd2;
  file_01.m_begin = (iterator)&local_198;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
             msg_01);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1b0 = (undefined4 *)BitStreamReader<DataStream>::Read(&bit_reader,1);
  local_b0 = &local_1b4;
  local_1b4 = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1b0 == (undefined4 *)0x0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_58 = "";
  local_78 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (BitStreamReader<DataStream> *)&local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_01388f88;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = (undefined4 ***)&local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_1b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_150,1,2,REQUIRE,0xf1da66,(size_t)&local_60,0xd2,&obj,"0U",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xd3;
  file_02.m_begin = (iterator)&local_1c8;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d8,
             msg_02);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1b0 = (undefined4 *)BitStreamReader<DataStream>::Read(&bit_reader,2);
  local_1b4 = 2;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1b0 == (undefined4 *)0x2);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_58 = "";
  local_78 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (BitStreamReader<DataStream> *)&local_88;
  local_b0 = &local_1b4;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_01388f88;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = (undefined4 ***)&local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_1b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_150,1,2,REQUIRE,0xf1da79,(size_t)&local_60,0xd3,&obj,"2U",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xd4;
  file_03.m_begin = (iterator)&local_1e8;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f8,
             msg_03);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1b0 = (undefined4 *)BitStreamReader<DataStream>::Read(&bit_reader,3);
  local_1b4 = 6;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1b0 == (undefined4 *)0x6);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_58 = "";
  local_78 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (BitStreamReader<DataStream> *)&local_88;
  local_b0 = &local_1b4;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_01388f88;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = (undefined4 ***)&local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_1b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_150,1,2,REQUIRE,0xf1da8c,(size_t)&local_60,0xd4,&obj,"6U",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xd5;
  file_04.m_begin = (iterator)&local_208;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_218,
             msg_04);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1b0 = (undefined4 *)BitStreamReader<DataStream>::Read(&bit_reader,4);
  local_1b4 = 0xb;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1b0 == (undefined4 *)0xb);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_58 = "";
  local_78 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (BitStreamReader<DataStream> *)&local_88;
  local_b0 = &local_1b4;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_01388f88;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = (undefined4 ***)&local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_1b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_150,1,2,REQUIRE,0xf1da9f,(size_t)&local_60,0xd5,&obj,"11U",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xd6;
  file_05.m_begin = (iterator)&local_228;
  msg_05.m_end = pvVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_238,
             msg_05);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1b0 = (undefined4 *)BitStreamReader<DataStream>::Read(&bit_reader,5);
  local_1b4 = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1b0 == (undefined4 *)0x1);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_58 = "";
  local_78 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (BitStreamReader<DataStream> *)&local_88;
  local_b0 = &local_1b4;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_01388f88;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = (undefined4 ***)&local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_1b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_150,1,2,REQUIRE,0xf1dab2,(size_t)&local_60,0xd6,&obj,"1U",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xd7;
  file_06.m_begin = (iterator)&local_248;
  msg_06.m_end = pvVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_258,
             msg_06);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1b0 = (undefined4 *)BitStreamReader<DataStream>::Read(&bit_reader,6);
  local_1b4 = 0x20;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1b0 == (undefined4 *)0x20);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_58 = "";
  local_78 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (BitStreamReader<DataStream> *)&local_88;
  local_b0 = &local_1b4;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_01388f88;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = (undefined4 ***)&local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_1b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_150,1,2,REQUIRE,0xf1dac5,(size_t)&local_60,0xd7,&obj,"32U",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xd8;
  file_07.m_begin = (iterator)&local_268;
  msg_07.m_end = pvVar2;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_278,
             msg_07);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1b0 = (undefined4 *)BitStreamReader<DataStream>::Read(&bit_reader,7);
  local_1b4 = 7;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1b0 == (undefined4 *)0x7);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_58 = "";
  local_78 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (BitStreamReader<DataStream> *)&local_88;
  local_b0 = &local_1b4;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_01388f88;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = (undefined4 ***)&local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_1b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_150,1,2,REQUIRE,0xf1dadc,(size_t)&local_60,0xd8,&obj,"7U",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xd9;
  file_08.m_begin = (iterator)&local_288;
  msg_08.m_end = pvVar2;
  msg_08.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_298,
             msg_08);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_1b0 = (undefined4 *)BitStreamReader<DataStream>::Read(&bit_reader,0x10);
  local_1b4 = 0x7721;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1b0 == (undefined4 *)0x7721);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_58 = "";
  local_78 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (BitStreamReader<DataStream> *)&local_88;
  local_b0 = &local_1b4;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_01388f88;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = (undefined4 ***)&local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_1b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_150,1,2,REQUIRE,0xf1daef,(size_t)&local_60,0xd9,&obj,"30497U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xda;
  file_09.m_begin = (iterator)&local_2a8;
  msg_09.m_end = pvVar2;
  msg_09.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2b8,
             msg_09);
  BitStreamReader<DataStream>::Read(&bit_reader,8);
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x64b98b;
  file_10.m_end = (iterator)0xda;
  file_10.m_begin = (iterator)&local_2c8;
  msg_10.m_end = pvVar2;
  msg_10.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2d8,
             msg_10);
  local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = false;
  _obj = &PTR__lazy_ostream_01389148;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (BitStreamReader<DataStream> *)0xe32320;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_2e0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)&obj,1,1,WARN,_cVar3,(size_t)&local_2e8,0xda);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&data_copy);
  BitStreamWriter<DataStream>::Flush(&bit_writer);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bitstream_reader_writer)
{
    DataStream data{};

    BitStreamWriter bit_writer{data};
    bit_writer.Write(0, 1);
    bit_writer.Write(2, 2);
    bit_writer.Write(6, 3);
    bit_writer.Write(11, 4);
    bit_writer.Write(1, 5);
    bit_writer.Write(32, 6);
    bit_writer.Write(7, 7);
    bit_writer.Write(30497, 16);
    bit_writer.Flush();

    DataStream data_copy{data};
    uint32_t serialized_int1;
    data >> serialized_int1;
    BOOST_CHECK_EQUAL(serialized_int1, uint32_t{0x7700C35A}); // NOTE: Serialized as LE
    uint16_t serialized_int2;
    data >> serialized_int2;
    BOOST_CHECK_EQUAL(serialized_int2, uint16_t{0x1072}); // NOTE: Serialized as LE

    BitStreamReader bit_reader{data_copy};
    BOOST_CHECK_EQUAL(bit_reader.Read(1), 0U);
    BOOST_CHECK_EQUAL(bit_reader.Read(2), 2U);
    BOOST_CHECK_EQUAL(bit_reader.Read(3), 6U);
    BOOST_CHECK_EQUAL(bit_reader.Read(4), 11U);
    BOOST_CHECK_EQUAL(bit_reader.Read(5), 1U);
    BOOST_CHECK_EQUAL(bit_reader.Read(6), 32U);
    BOOST_CHECK_EQUAL(bit_reader.Read(7), 7U);
    BOOST_CHECK_EQUAL(bit_reader.Read(16), 30497U);
    BOOST_CHECK_THROW(bit_reader.Read(8), std::ios_base::failure);
}